

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O2

void __thiscall
chrono::ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::
ChConstraintTuple_3vars
          (ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_> *this,
          ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_> *other)

{
  ChVariables *pCVar1;
  
  pCVar1 = other->variables_2;
  this->variables_1 = other->variables_1;
  this->variables_2 = pCVar1;
  this->variables_3 = other->variables_3;
  Eigen::internal::call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
            (&this->Cq_1,&other->Cq_1);
  Eigen::internal::call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
            (&this->Cq_2,&other->Cq_2);
  Eigen::internal::call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
            (&this->Cq_3,&other->Cq_3);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&this->Eq_1,&other->Eq_1);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&this->Eq_2,&other->Eq_2);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&this->Eq_3,&other->Eq_3);
  return;
}

Assistant:

ChConstraintTuple_3vars(const ChConstraintTuple_3vars& other) {
        variables_1 = other.variables_1;
        variables_2 = other.variables_2;
        variables_3 = other.variables_3;
        Cq_1 = other.Cq_1;
        Cq_2 = other.Cq_2;
        Cq_3 = other.Cq_3;
        Eq_1 = other.Eq_1;
        Eq_2 = other.Eq_2;
        Eq_3 = other.Eq_3;
    }